

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::InnerMap
          (InnerMap *this,ulong n,Arena *param_3)

{
  ulong uVar1;
  pointer __s;
  size_type n_00;
  MapAllocator<void_*> local_20;
  
  this->num_elements_ = 0;
  uVar1 = rdtsc();
  this->seed_ = (long)&this->num_elements_ + (uVar1 & 0xffffffff00000000) + (uVar1 & 0xffffffff);
  this->table_ = (void **)0x0;
  (this->alloc_).arena_ = param_3;
  n_00 = 8;
  if (8 < n) {
    n_00 = n;
  }
  local_20.arena_ = param_3;
  __s = MapAllocator<void_*>::allocate(&local_20,n_00,(void *)0x0);
  memset(__s,0,n_00 * 8);
  this->table_ = __s;
  this->index_of_first_non_null_ = n_00;
  this->num_buckets_ = n_00;
  return;
}

Assistant:

InnerMap(size_type n, hasher h, Allocator alloc)
        : hasher(h),
          num_elements_(0),
          seed_(Seed()),
          table_(NULL),
          alloc_(alloc) {
      n = TableSize(n);
      table_ = CreateEmptyTable(n);
      num_buckets_ = index_of_first_non_null_ = n;
    }